

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snedecor_f_dist.hpp
# Opt level: O1

result_type_conflict2 __thiscall
trng::snedecor_f_dist<double>::cdf(snedecor_f_dist<double> *this,result_type_conflict2 x)

{
  double dVar1;
  double norm;
  double dVar2;
  double y;
  double dVar3;
  
  dVar3 = (double)(this->P).n_;
  dVar2 = (double)(this->P).m_;
  dVar1 = x * dVar3;
  dVar3 = dVar3 * 0.5;
  y = dVar2 * 0.5;
  norm = math::detail::Beta<double>(dVar3,y);
  dVar1 = math::detail::Beta_I<double>(dVar1 / (dVar1 + dVar2),dVar3,y,norm);
  return dVar1;
}

Assistant:

cdf(result_type x) const {
      const result_type n{static_cast<result_type>(P.n())};
      const result_type m{static_cast<result_type>(P.m())};
      return math::Beta_I(n * x / (m + n * x), result_type(1) / result_type(2) * n,
                          result_type(1) / result_type(2) * m);
    }